

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::~PromiseClient(PromiseClient *this)

{
  ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pFVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  ImportClient *in_RAX;
  Import *import;
  Maybe<capnp::_::RpcSystemBase::RpcConnectionState::ImportClient_&> local_18;
  
  if ((this->importId).ptr.isSet == true) {
    local_18.ptr = in_RAX;
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *)
           &stack0xffffffffffffffe8,(int)(this->super_RpcClient).connectionState.ptr + 0x7a8);
    if ((local_18.ptr != (ImportClient *)0x0) &&
       ((PromiseClient *)((local_18.ptr)->super_RpcClient).super_ClientHook.brand == this)) {
      ((local_18.ptr)->super_RpcClient).super_ClientHook.brand = (void *)0x0;
    }
  }
  pFVar1 = (this->fork).hub.ptr;
  if (pFVar1 != (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    (this->fork).hub.ptr = (ForkHub<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pDVar2 = (this->fork).hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar1->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  pCVar3 = (this->cap).ptr;
  if (pCVar3 != (ClientHook *)0x0) {
    (this->cap).ptr = (ClientHook *)0x0;
    pDVar2 = (this->cap).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  RpcClient::~RpcClient(&this->super_RpcClient);
  return;
}

Assistant:

~PromiseClient() noexcept(false) {
      KJ_IF_SOME(id, importId) {
        // This object is representing an import promise.  That means the import table may still
        // contain a pointer back to it.  Remove that pointer.  Note that we have to verify that
        // the import still exists and the pointer still points back to this object because this
        // object may actually outlive the import.
        KJ_IF_SOME(import, connectionState->imports.find(id)) {
          KJ_IF_SOME(c, import.appClient) {
            if (&c == this) {
              import.appClient = kj::none;
            }
          }
        }
      }
    }